

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.cpp
# Opt level: O0

void __thiscall Config::readFromConfig(Config *this,Confparse *obvconfig)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *in_RSI;
  Confparse *in_RDI;
  double dVar4;
  char *unaff_retaddr;
  char *in_stack_00000098;
  Config *in_stack_000000a0;
  Confparse *this_00;
  
  this_00 = in_RDI;
  iVar2 = getDPI();
  if (iVar2 == 0) {
    iVar2 = Confparse::ParseInt(obvconfig,unaff_retaddr,(int)((ulong)this_00 >> 0x20));
    *(int *)&(in_RDI->filepath)._M_pathname._M_string_length = iVar2;
  }
  if ((int)(in_RDI->filepath)._M_pathname._M_string_length < 0x32) {
    *(undefined4 *)&(in_RDI->filepath)._M_pathname._M_string_length = 0x32;
  }
  if (400 < (int)(in_RDI->filepath)._M_pathname._M_string_length) {
    *(undefined4 *)&(in_RDI->filepath)._M_pathname._M_string_length = 400;
  }
  iVar2 = Confparse::ParseInt(obvconfig,unaff_retaddr,(int)((ulong)this_00 >> 0x20));
  *(int *)&(in_RDI->filepath)._M_pathname = iVar2;
  iVar2 = Confparse::ParseInt(obvconfig,unaff_retaddr,(int)((ulong)this_00 >> 0x20));
  *(int *)&(in_RDI->filepath)._M_pathname.field_0x4 = iVar2;
  dVar4 = Confparse::ParseDouble(obvconfig,unaff_retaddr,(double)this_00);
  (in_RDI->filepath)._M_pathname.field_2._M_allocated_capacity = (size_type)dVar4;
  pcVar3 = Confparse::ParseStr(this_00,in_RSI,(char *)in_RDI);
  std::__cxx11::string::operator=
            ((string *)((in_RDI->filepath)._M_pathname.field_2._M_local_buf + 8),pcVar3);
  dVar4 = Confparse::ParseDouble(obvconfig,unaff_retaddr,(double)this_00);
  *(float *)(in_RDI->value + 0x38) = (float)dVar4;
  bVar1 = Confparse::ParseBool(this_00,in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  in_RDI->value[0x3c] = bVar1;
  bVar1 = Confparse::ParseBool(this_00,in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  in_RDI->value[0x3d] = bVar1;
  if (((in_RDI->value[0x3d] & 1U) == 0) && ((in_RDI->value[0x3c] & 1U) == 0)) {
    in_RDI->value[0x3c] = '\x01';
  }
  bVar1 = Confparse::ParseBool(this_00,in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  in_RDI->value[0x4b] = bVar1;
  dVar4 = Confparse::ParseDouble(obvconfig,unaff_retaddr,(double)this_00);
  *(float *)(in_RDI->value + 0x4c) = (float)dVar4;
  dVar4 = Confparse::ParseDouble(obvconfig,unaff_retaddr,(double)this_00);
  *(float *)(in_RDI->value + 0x50) = (float)dVar4;
  bVar1 = Confparse::ParseBool(this_00,in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  in_RDI->value[0x3e] = bVar1;
  iVar2 = Confparse::ParseInt(obvconfig,unaff_retaddr,(int)((ulong)this_00 >> 0x20));
  *(int *)(in_RDI->value + 0x30) = iVar2;
  bVar1 = Confparse::ParseBool(this_00,in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  in_RDI->value[0x40] = bVar1;
  bVar1 = Confparse::ParseBool(this_00,in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  in_RDI->value[0x42] = bVar1;
  bVar1 = Confparse::ParseBool(this_00,in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  in_RDI->value[0x5e] = bVar1;
  bVar1 = Confparse::ParseBool(this_00,in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  in_RDI->value[0x5d] = bVar1;
  dVar4 = Confparse::ParseDouble(obvconfig,unaff_retaddr,(double)this_00);
  *(float *)(in_RDI->value + 0x14) = (float)dVar4;
  iVar2 = Confparse::ParseInt(obvconfig,unaff_retaddr,(int)((ulong)this_00 >> 0x20));
  *(int *)(in_RDI->value + 0x44) = iVar2;
  bVar1 = Confparse::ParseBool(this_00,in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  in_RDI->value[0x48] = bVar1;
  bVar1 = Confparse::ParseBool(this_00,in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  in_RDI->value[0x5c] = bVar1;
  bVar1 = Confparse::ParseBool(this_00,in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  in_RDI->value[0x41] = bVar1;
  bVar1 = Confparse::ParseBool(this_00,in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  in_RDI->value[0x49] = bVar1;
  bVar1 = Confparse::ParseBool(this_00,in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  in_RDI->value[0x4a] = bVar1;
  bVar1 = Confparse::ParseBool(this_00,in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  in_RDI->value[0x54] = bVar1;
  bVar1 = Confparse::ParseBool(this_00,in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  in_RDI->value[0x56] = bVar1;
  bVar1 = Confparse::ParseBool(this_00,in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  in_RDI->value[0x57] = bVar1;
  bVar1 = Confparse::ParseBool(this_00,in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  in_RDI->value[0x5f] = bVar1;
  iVar2 = Confparse::ParseInt(obvconfig,unaff_retaddr,(int)((ulong)this_00 >> 0x20));
  *(int *)(in_RDI->value + 0x24) = iVar2;
  bVar1 = Confparse::ParseBool(this_00,in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  in_RDI->value[0x55] = bVar1;
  iVar2 = Confparse::ParseInt(obvconfig,unaff_retaddr,(int)((ulong)this_00 >> 0x20));
  *(int *)(in_RDI->value + 0x58) = iVar2;
  dVar4 = Confparse::ParseDouble(obvconfig,unaff_retaddr,(double)this_00);
  *(float *)(in_RDI->value + 0x10) = (float)dVar4;
  iVar2 = Confparse::ParseInt(obvconfig,unaff_retaddr,(int)((ulong)this_00 >> 0x20));
  *(int *)(in_RDI->value + 0x18) = iVar2;
  iVar2 = Confparse::ParseInt(obvconfig,unaff_retaddr,(int)((ulong)this_00 >> 0x20));
  *(int *)(in_RDI->value + 0x1c) = iVar2;
  iVar2 = Confparse::ParseInt(obvconfig,unaff_retaddr,(int)((ulong)this_00 >> 0x20));
  *(int *)(in_RDI->value + 0x20) = iVar2;
  iVar2 = Confparse::ParseInt(obvconfig,unaff_retaddr,(int)((ulong)this_00 >> 0x20));
  *(int *)(in_RDI->value + 0x2c) = iVar2;
  iVar2 = Confparse::ParseInt(obvconfig,unaff_retaddr,(int)((ulong)this_00 >> 0x20));
  *(int *)(in_RDI->value + 0x28) = iVar2;
  iVar2 = Confparse::ParseInt(obvconfig,unaff_retaddr,(int)((ulong)this_00 >> 0x20));
  *(int *)(in_RDI->value + 0x34) = iVar2;
  bVar1 = Confparse::ParseBool(this_00,in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  in_RDI->value[0x3f] = (in_RDI->value[0x3f] & 1U) != 0 || bVar1;
  Confparse::ParseStr(this_00,in_RSI,(char *)in_RDI);
  SetFZKey(in_stack_000000a0,in_stack_00000098);
  Confparse::ParseStr(this_00,in_RSI,(char *)in_RDI);
  SetCAEKey(in_stack_000000a0,in_stack_00000098);
  return;
}

Assistant:

void Config::readFromConfig(Confparse &obvconfig) {
	// Special test here, in case we've already set the dpi from external
	// such as command line.
	if (getDPI() == 0) dpi = obvconfig.ParseInt("dpi", 100);
	if (dpi < 50) dpi = 50;
	if (dpi > 400) dpi = 400;

	windowX = obvconfig.ParseInt("windowX", 1100);
	windowY = obvconfig.ParseInt("windowY", 700);

	fontSize            = obvconfig.ParseDouble("fontSize", 20);
	fontName            = obvconfig.ParseStr("fontName", "");
	pinSizeThresholdLow = obvconfig.ParseDouble("pinSizeThresholdLow", 0);
	pinShapeSquare      = obvconfig.ParseBool("pinShapeSquare", false);
	pinShapeCircle      = obvconfig.ParseBool("pinShapeCircle", true);

	if ((!pinShapeCircle) && (!pinShapeSquare)) {
		pinShapeSquare = true;
	}


	pinHalo          = obvconfig.ParseBool("pinHalo", true);
	pinHaloDiameter  = obvconfig.ParseDouble("pinHaloDiameter", 1.25);
	pinHaloThickness = obvconfig.ParseDouble("pinHaloThickness", 2.0);
	pinSelectMasks   = obvconfig.ParseBool("pinSelectMasks", true);

	pinA1threshold	  = obvconfig.ParseInt("pinA1threshold", 3);

	showFPS                   = obvconfig.ParseBool("showFPS", false);
	showInfoPanel             = obvconfig.ParseBool("showInfoPanel", true);
	infoPanelSelectPartsOnNet = obvconfig.ParseBool("infoPanelSelectPartsOnNet", true);
	infoPanelCenterZoomNets   = obvconfig.ParseBool("infoPanelCenterZoomNets", true);
	partZoomScaleOutFactor    = obvconfig.ParseDouble("partZoomScaleOutFactor", 3.0f);

	infoPanelWidth            = obvconfig.ParseInt("infoPanelWidth", 350);
	showPins                  = obvconfig.ParseBool("showPins", true);
	showPosition              = obvconfig.ParseBool("showPosition", true);
	showNetWeb                = obvconfig.ParseBool("showNetWeb", true);
	showAnnotations           = obvconfig.ParseBool("showAnnotations", true);
	showBackgroundImage       = obvconfig.ParseBool("showBackgroundImage", true);
	fillParts                 = obvconfig.ParseBool("fillParts", true);
	showPartName              = obvconfig.ParseBool("showPartName", true);
	showPinName               = obvconfig.ParseBool("showPinName", true);
	centerZoomSearchResults = obvconfig.ParseBool("centerZoomSearchResults", true);
	flipMode                  = obvconfig.ParseInt("flipMode", 0);

	boardFill        = obvconfig.ParseBool("boardFill", true);
	boardFillSpacing = obvconfig.ParseInt("boardFillSpacing", 3);

	zoomFactor   = obvconfig.ParseDouble("zoomFactor", 0.5f);
	zoomModifier = obvconfig.ParseInt("zoomModifier", 5);

	panFactor = obvconfig.ParseInt("panFactor", 30);

	panModifier = obvconfig.ParseInt("panModifier", 5);

	annotationBoxSize = obvconfig.ParseInt("annotationBoxSize", 15);

	annotationBoxOffset = obvconfig.ParseInt("annotationBoxOffset", 8);

	netWebThickness = obvconfig.ParseInt("netWebThickness", 2);


#ifdef _WIN32
	pdfSoftwarePath = obvconfig.ParseStr("pdfSoftwarePath", "SumatraPDF.exe");
#endif

	/*
	 * Some machines (Atom etc) don't have enough CPU/GPU
	 * grunt to cope with the large number of AA'd circles
	 * generated on a large dense board like a Macbook Pro
	 * so we have the lowCPU option which will let people
	 * trade good-looks for better FPS
	 *
	 * If we want slowCPU to take impact from a command line
	 * parameter, we need it to be set to false before we
	 * call this.
	 */
	slowCPU |= obvconfig.ParseBool("slowCPU", false);

	/*
	 * The asus .fz and Asrock .cae file formats require a specific key to be decoded.
	 *
	 * This key is supplied in the obv.conf file as a long single line
	 * of comma/space separated 32-bit hex values 0x1234abcd etc.
	 *
	 */
	SetFZKey(obvconfig.ParseStr("FZKey", ""));
	SetCAEKey(obvconfig.ParseStr("CAEKey", ""));
}